

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O1

void __thiscall
QOpenGLCompositor::changeWindowIndex
          (QOpenGLCompositor *this,QOpenGLCompositorWindow *window,int newIdx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  iterator iVar6;
  long lVar7;
  long in_FS_OFFSET;
  QOpenGLCompositorWindow *local_40;
  void *local_38;
  QOpenGLCompositorWindow **ppQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->m_windows).d.size;
  if (lVar2 != 0) {
    lVar5 = local_20;
    lVar7 = -8;
    do {
      iVar4 = (int)lVar5;
      lVar1 = lVar2 * -8 + lVar7;
      if (lVar1 == -8) goto LAB_00175b80;
      lVar5 = lVar7 + 8;
      lVar3 = lVar7 + 8;
      lVar7 = lVar5;
    } while (*(QOpenGLCompositorWindow **)((long)(this->m_windows).d.ptr + lVar3) != window);
    iVar4 = (int)(lVar5 >> 3);
LAB_00175b80:
    if (lVar1 != -8) goto LAB_00175b8d;
  }
  iVar4 = -1;
LAB_00175b8d:
  if (iVar4 != newIdx && iVar4 != -1) {
    QList<QOpenGLCompositorWindow_*>::move(&this->m_windows,(long)iVar4,(long)newIdx);
    ensureCorrectZOrder(this);
    if ((this->m_windows).d.ptr[(this->m_windows).d.size + -1] == window) {
      iVar6 = QList<QOpenGLCompositorWindow_*>::end(&this->m_windows);
      local_40 = iVar6.i[-1];
      ppQStack_30 = &local_40;
      local_38 = (void *)0x0;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositor::changeWindowIndex(QOpenGLCompositorWindow *window, int newIdx)
{
    int idx = m_windows.indexOf(window);
    if (idx != -1 && idx != newIdx) {
        m_windows.move(idx, newIdx);
        ensureCorrectZOrder();
        if (window == m_windows.constLast())
            emit topWindowChanged(m_windows.last());
    }
}